

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

void __thiscall mjs::while_statement::print(while_statement *this,wostream *os)

{
  expression *peVar1;
  statement *psVar2;
  wostream *pwVar3;
  
  pwVar3 = std::operator<<(os,"while_statement{");
  peVar1 = (this->cond_)._M_t.
           super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
           super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
           super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  (**(code **)((long)(peVar1->super_syntax_node)._vptr_syntax_node + 0x10))(peVar1,pwVar3);
  pwVar3 = std::operator<<(pwVar3,", ");
  psVar2 = (this->s_)._M_t.
           super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
           super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
           super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
  (**(code **)((long)(psVar2->super_syntax_node)._vptr_syntax_node + 0x10))(psVar2,pwVar3);
  std::operator<<(pwVar3,"}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os  << "while_statement{" << *cond_ << ", " << *s_ << "}";
    }